

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O3

QAbstractItemModel * createTableModel(QObject *parent)

{
  int iVar1;
  QStandardItemModel *this;
  ulong uVar2;
  ulong uVar3;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  QArrayData *local_a8;
  char16_t *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  QArrayData *local_78 [3];
  QString local_60;
  undefined1 local_48 [24];
  
  this = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this,parent);
  local_c8._forAlignment = -NAN;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  (**(code **)(*(long *)this + 0xf8))(this,0,5,&local_c8);
  local_c8._forAlignment = -NAN;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  (**(code **)(*(long *)this + 0x100))(this,0,3,&local_c8);
  local_c8._forAlignment = -NAN;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = 0;
  iVar1 = (**(code **)(*(long *)this + 0x78))(this,&local_c8);
  if (0 < iVar1) {
    uVar3 = 0;
    do {
      local_c8._forAlignment = -NAN;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = 0;
      iVar1 = (**(code **)(*(long *)this + 0x80))(this,&local_c8);
      if (0 < iVar1) {
        uVar2 = 0;
        do {
          local_90 = 0xffffffffffffffff;
          local_88 = 0;
          uStack_80 = 0;
          (**(code **)(*(long *)this + 0x60))
                    (local_48,this,uVar3 & 0xffffffff,uVar2 & 0xffffffff,&local_90);
          local_a8 = (QArrayData *)0x0;
          local_a0 = L"%1,%2";
          local_98 = 5;
          QString::arg((longlong)local_78,(int)&local_a8,(int)uVar3,(QChar)0x0);
          QString::arg((longlong)&local_60,(int)local_78,(int)uVar2,(QChar)0x0);
          QVariant::QVariant((QVariant *)&local_c8,&local_60);
          (**(code **)(*(long *)this + 0x98))(this,local_48,&local_c8,2);
          QVariant::~QVariant((QVariant *)&local_c8);
          if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
            }
          }
          if (local_78[0] != (QArrayData *)0x0) {
            LOCK();
            (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_78[0],2,8);
            }
          }
          if (local_a8 != (QArrayData *)0x0) {
            LOCK();
            (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_a8,2,8);
            }
          }
          local_90 = 0xffffffffffffffff;
          local_88 = 0;
          uStack_80 = 0;
          (**(code **)(*(long *)this + 0x60))
                    (local_48,this,uVar3 & 0xffffffff,uVar2 & 0xffffffff,&local_90);
          QVariant::QVariant((QVariant *)&local_c8,(int)uVar3);
          (**(code **)(*(long *)this + 0x98))(this,local_48,&local_c8,0x100);
          QVariant::~QVariant((QVariant *)&local_c8);
          local_90 = 0xffffffffffffffff;
          local_88 = 0;
          uStack_80 = 0;
          (**(code **)(*(long *)this + 0x60))
                    (local_48,this,uVar3 & 0xffffffff,uVar2 & 0xffffffff,&local_90);
          QVariant::QVariant((QVariant *)&local_c8,(int)uVar2);
          (**(code **)(*(long *)this + 0x98))(this,local_48,&local_c8,0x101);
          QVariant::~QVariant((QVariant *)&local_c8);
          uVar2 = uVar2 + 1;
          local_c8._forAlignment = -NAN;
          local_c8._8_8_ = 0;
          local_c8._16_8_ = 0;
          iVar1 = (**(code **)(*(long *)this + 0x80))(this,&local_c8);
        } while ((long)uVar2 < (long)iVar1);
      }
      uVar3 = uVar3 + 1;
      local_c8._forAlignment = -NAN;
      local_c8._8_8_ = 0;
      local_c8._16_8_ = 0;
      iVar1 = (**(code **)(*(long *)this + 0x78))(this,&local_c8);
    } while ((long)uVar3 < (long)iVar1);
  }
  return (QAbstractItemModel *)this;
}

Assistant:

QAbstractItemModel *createTableModel(QObject *parent)
{
    QAbstractItemModel *result = nullptr;
#ifdef COMPLEX_MODEL_SUPPORT
    result = new ComplexModel(parent);
    result->insertRows(0, 5);
    result->insertColumns(0, 3);
    for (int i = 0; i < result->rowCount(); ++i) {
        for (int j = 0; j < result->columnCount(); ++j) {
            result->setData(result->index(i, j), QStringLiteral("%1,%2").arg(i).arg(j), Qt::EditRole);
            result->setData(result->index(i, j), i, Qt::UserRole);
            result->setData(result->index(i, j), j, Qt::UserRole + 1);
        }
    }
#endif
    return result;
}